

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintCommand.cpp
# Opt level: O0

double __thiscall PrintCommand::execute(PrintCommand *this)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *pmVar2;
  pointer ppVar3;
  ostream *this_00;
  ostream *poVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>
  local_30;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>
  local_28;
  _Self local_20;
  _Self local_18;
  PrintCommand *local_10;
  PrintCommand *this_local;
  
  local_10 = this;
  pmVar2 = DataBase::getInVarMap_abi_cxx11_(data);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
       ::find(pmVar2,&this->message);
  pmVar2 = DataBase::getInVarMap_abi_cxx11_(data);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
       ::end(pmVar2);
  bVar1 = std::operator!=(&local_18,&local_20);
  if (bVar1) {
    pmVar2 = DataBase::getInVarMap_abi_cxx11_(data);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
         ::find(pmVar2,&this->message);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>
             ::operator->(&local_28);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)ppVar3);
    poVar4 = std::operator<<(poVar4,": ");
    pmVar2 = DataBase::getInVarMap_abi_cxx11_(data);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
         ::find(pmVar2,&this->message);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>
             ::operator->(&local_30);
    (**(ppVar3->second->super_Expression)._vptr_Expression)();
    std::ostream::operator<<(poVar4,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)&this->message);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return 0.0;
}

Assistant:

double PrintCommand::execute() {
  if (data->getInVarMap()->find(this->message) != data->getInVarMap()->end()) {
    cout << data->getInVarMap()->find(this->message)->first <<
         ": " << data->getInVarMap()->find(this->message)->second->calculate()
         << endl;
  } else {
    cout << this->message << endl;
  }
  return 0;
}